

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::ParsedScene::MakeNamedMaterial
          (ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  pointer ppVar1;
  ParameterDictionary parameters;
  __type _Var2;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  pointer __lhs;
  char *fmt;
  ParameterDictionary dict;
  undefined8 in_stack_fffffffffffffd10;
  ParameterDictionary *this_00;
  undefined1 in_stack_fffffffffffffd20 [64];
  undefined1 in_stack_fffffffffffffd60 [24];
  ParameterDictionary local_258;
  SceneEntity local_1f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
  local_150;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_90;
  
  if (this->currentApiState == OptionsBlock) {
    fmt = "Scene description must be inside world block; \"%s\" not allowed. Ignoring.";
  }
  else {
    if (this->currentApiState != Uninitialized) {
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::InlinedVector(&local_90,in_RDX);
      this_00 = &local_258;
      ParameterDictionary::ParameterDictionary
                (this_00,&local_90,&this->graphicsState->materialAttributes,
                 this->graphicsState->colorSpace);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector(&local_90);
      __lhs = (this->namedMaterials).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->namedMaterials).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (__lhs == ppVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stack0xfffffffffffffd20,"",
                     (allocator<char> *)&stack0xfffffffffffffd17);
          ParameterDictionary::ParameterDictionary
                    ((ParameterDictionary *)&stack0xfffffffffffffd40,&local_258);
          parameters.params.ptr = params.ptr;
          parameters.params.alloc =
               (polymorphic_allocator<pbrt::ParsedParameter_*>)
               (polymorphic_allocator<pbrt::ParsedParameter_*>)params.alloc.memoryResource;
          parameters.params.field_2.fixed[0] = params.field_2.fixed[0];
          parameters.params.field_2.fixed[1] = (ParsedParameter *)in_stack_fffffffffffffd10;
          parameters.params.field_2.fixed[2] = (ParsedParameter *)this_00;
          parameters._40_64_ = in_stack_fffffffffffffd20;
          SceneEntity::SceneEntity
                    (&local_1f0,(string *)&stack0xfffffffffffffd20,parameters,
                     (FileLoc)in_stack_fffffffffffffd60);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
          ::pair<pbrt::SceneEntity,_true>(&local_150,name,&local_1f0);
          std::
          vector<std::pair<std::__cxx11::string,pbrt::SceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::SceneEntity>>>
          ::emplace_back<std::pair<std::__cxx11::string,pbrt::SceneEntity>>
                    ((vector<std::pair<std::__cxx11::string,pbrt::SceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::SceneEntity>>>
                      *)&this->namedMaterials,&local_150);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
          ::~pair(&local_150);
          SceneEntity::~SceneEntity(&local_1f0);
          InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
          ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                            *)&stack0xfffffffffffffd40);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffd20);
          goto LAB_0028b03a;
        }
        _Var2 = std::operator==(&__lhs->first,name);
        __lhs = __lhs + 1;
      } while (!_Var2);
      (this->super_SceneRepresentation).errorExit = true;
      Error<std::__cxx11::string_const&>((FileLoc *)&params,"%s: named material redefined.",name);
LAB_0028b03a:
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector(&local_258.params);
      return;
    }
    fmt = "pbrtInit() must be before calling \"%s()\". Ignoring.";
  }
  Error<char_const(&)[18]>((FileLoc *)&params,fmt,(char (*) [18])"MakeNamedMaterial");
  return;
}

Assistant:

void ParsedScene::MakeNamedMaterial(const std::string &name, ParsedParameterVector params,
                                    FileLoc loc) {
    VERIFY_WORLD("MakeNamedMaterial");

    ParameterDictionary dict(std::move(params), graphicsState->materialAttributes,
                             graphicsState->colorSpace);

    // Note: O(n). FIXME?
    for (const auto &nm : namedMaterials)
        if (nm.first == name) {
            ErrorExitDeferred(&loc, "%s: named material redefined.", name);
            return;
        }

    namedMaterials.push_back(std::make_pair(name, SceneEntity("", std::move(dict), loc)));
}